

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode ZSTD_XXH32_update(XXH32_state_t *state,void *input,size_t len)

{
  xxh_u32 xVar1;
  xxh_u32 xVar2;
  xxh_u8 *pxVar3;
  xxh_u8 *limit;
  xxh_u32 *p32;
  xxh_u8 *bEnd;
  xxh_u8 *p;
  size_t len_local;
  void *input_local;
  XXH32_state_t *state_local;
  
  if (input != (void *)0x0) {
    pxVar3 = (xxh_u8 *)((long)input + len);
    state->total_len_32 = (int)len + state->total_len_32;
    state->large_len = (uint)(0xf < len || 0xf < state->total_len_32) | state->large_len;
    if (state->memsize + len < 0x10) {
      XXH_memcpy((void *)((long)state->mem32 + (ulong)state->memsize),input,len);
      state->memsize = (int)len + state->memsize;
    }
    else {
      bEnd = (xxh_u8 *)input;
      if (state->memsize != 0) {
        XXH_memcpy((void *)((long)state->mem32 + (ulong)state->memsize),input,
                   (ulong)(0x10 - state->memsize));
        xVar2 = state->v[0];
        xVar1 = XXH_readLE32(state->mem32);
        xVar2 = XXH32_round(xVar2,xVar1);
        state->v[0] = xVar2;
        xVar2 = state->v[1];
        xVar1 = XXH_readLE32(state->mem32 + 1);
        xVar2 = XXH32_round(xVar2,xVar1);
        state->v[1] = xVar2;
        xVar2 = state->v[2];
        xVar1 = XXH_readLE32(state->mem32 + 2);
        xVar2 = XXH32_round(xVar2,xVar1);
        state->v[2] = xVar2;
        xVar2 = state->v[3];
        xVar1 = XXH_readLE32(state->mem32 + 3);
        xVar2 = XXH32_round(xVar2,xVar1);
        state->v[3] = xVar2;
        bEnd = (xxh_u8 *)((long)input + (ulong)(0x10 - state->memsize));
        state->memsize = 0;
      }
      if (bEnd <= pxVar3 + -0x10) {
        do {
          xVar2 = state->v[0];
          xVar1 = XXH_readLE32(bEnd);
          xVar2 = XXH32_round(xVar2,xVar1);
          state->v[0] = xVar2;
          xVar2 = state->v[1];
          xVar1 = XXH_readLE32(bEnd + 4);
          xVar2 = XXH32_round(xVar2,xVar1);
          state->v[1] = xVar2;
          xVar2 = state->v[2];
          xVar1 = XXH_readLE32(bEnd + 8);
          xVar2 = XXH32_round(xVar2,xVar1);
          state->v[2] = xVar2;
          xVar2 = state->v[3];
          xVar1 = XXH_readLE32(bEnd + 0xc);
          xVar2 = XXH32_round(xVar2,xVar1);
          state->v[3] = xVar2;
          bEnd = bEnd + 0x10;
        } while (bEnd <= pxVar3 + -0x10);
      }
      if (bEnd < pxVar3) {
        XXH_memcpy(state->mem32,bEnd,(long)pxVar3 - (long)bEnd);
        state->memsize = (int)pxVar3 - (int)bEnd;
      }
    }
  }
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH32_update(XXH32_state_t* state, const void* input, size_t len)
{
    if (input==NULL) {
        XXH_ASSERT(len == 0);
        return XXH_OK;
    }

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len_32 += (XXH32_hash_t)len;
        state->large_len |= (XXH32_hash_t)((len>=16) | (state->total_len_32>=16));

        if (state->memsize + len < 16)  {   /* fill in tmp buffer */
            XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, len);
            state->memsize += (XXH32_hash_t)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* some data left from previous update */
            XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, 16-state->memsize);
            {   const xxh_u32* p32 = state->mem32;
                state->v[0] = XXH32_round(state->v[0], XXH_readLE32(p32)); p32++;
                state->v[1] = XXH32_round(state->v[1], XXH_readLE32(p32)); p32++;
                state->v[2] = XXH32_round(state->v[2], XXH_readLE32(p32)); p32++;
                state->v[3] = XXH32_round(state->v[3], XXH_readLE32(p32));
            }
            p += 16-state->memsize;
            state->memsize = 0;
        }

        if (p <= bEnd-16) {
            const xxh_u8* const limit = bEnd - 16;

            do {
                state->v[0] = XXH32_round(state->v[0], XXH_readLE32(p)); p+=4;
                state->v[1] = XXH32_round(state->v[1], XXH_readLE32(p)); p+=4;
                state->v[2] = XXH32_round(state->v[2], XXH_readLE32(p)); p+=4;
                state->v[3] = XXH32_round(state->v[3], XXH_readLE32(p)); p+=4;
            } while (p<=limit);

        }

        if (p < bEnd) {
            XXH_memcpy(state->mem32, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}